

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdbmp.c
# Opt level: O0

JDIMENSION get_24bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  size_t sVar8;
  byte *pbVar9;
  byte *pbVar10;
  long in_RSI;
  long *in_RDI;
  double dVar11;
  double dVar12;
  double dVar13;
  int ps;
  int aindex;
  int bindex;
  int gindex;
  int rindex;
  JSAMPLE r;
  JSAMPLE g;
  JSAMPLE b;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY image_ptr;
  bmp_source_ptr source;
  double ktmp;
  double ytmp;
  double mtmp;
  double ctmp;
  double local_b0;
  double local_a8;
  double local_a0;
  int local_7c;
  undefined1 *local_78;
  byte *local_70;
  double local_40;
  double local_38;
  double local_30;
  
  if (*(int *)(in_RSI + 0x58) == 0) {
    sVar8 = fread(*(void **)(in_RSI + 0x60),1,(ulong)*(uint *)(in_RSI + 0x4c),
                  *(FILE **)(in_RSI + 0x18));
    if (sVar8 != *(uint *)(in_RSI + 0x4c)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x2b;
      (**(code **)*in_RDI)(in_RDI);
    }
    local_70 = *(byte **)(in_RSI + 0x60);
  }
  else {
    *(int *)(in_RSI + 0x48) = *(int *)(in_RSI + 0x48) + -1;
    puVar7 = (undefined8 *)
             (**(code **)(in_RDI[1] + 0x38))
                       (in_RDI,*(undefined8 *)(in_RSI + 0x40),*(undefined4 *)(in_RSI + 0x48),1,0);
    local_70 = (byte *)*puVar7;
  }
  local_78 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  if (*(int *)((long)in_RDI + 0x3c) == 8) {
    memcpy(local_78,local_70,(ulong)*(uint *)(in_RSI + 0x4c));
  }
  else if (*(int *)((long)in_RDI + 0x3c) == 4) {
    for (local_7c = (int)in_RDI[6]; local_7c != 0; local_7c = local_7c + -1) {
      pbVar9 = local_70 + 1;
      bVar1 = *local_70;
      pbVar10 = local_70 + 2;
      local_70 = local_70 + 3;
      dVar13 = 1.0 - (double)*pbVar10 / 255.0;
      dVar11 = 1.0 - (double)*pbVar9 / 255.0;
      dVar12 = 1.0 - (double)bVar1 / 255.0;
      local_a0 = dVar11;
      if (dVar13 < dVar11) {
        local_a0 = dVar13;
      }
      local_b0 = dVar12;
      if (local_a0 < dVar12) {
        local_a8 = dVar11;
        if (dVar13 < dVar11) {
          local_a8 = dVar13;
        }
        local_b0 = local_a8;
      }
      if ((local_b0 != 1.0) || (NAN(local_b0))) {
        local_30 = (dVar13 - local_b0) / (1.0 - local_b0);
        local_38 = (dVar11 - local_b0) / (1.0 - local_b0);
        local_40 = (dVar12 - local_b0) / (1.0 - local_b0);
      }
      else {
        local_40 = 0.0;
        local_38 = 0.0;
        local_30 = 0.0;
      }
      *local_78 = (char)(int)((255.0 - local_30 * 255.0) + 0.5);
      local_78[1] = (char)(int)((255.0 - local_38 * 255.0) + 0.5);
      local_78[2] = (char)(int)((255.0 - local_40 * 255.0) + 0.5);
      local_78[3] = (char)(int)((255.0 - local_b0 * 255.0) + 0.5);
      local_78 = local_78 + 4;
    }
  }
  else {
    iVar2 = rgb_red[*(uint *)((long)in_RDI + 0x3c)];
    iVar3 = rgb_green[*(uint *)((long)in_RDI + 0x3c)];
    iVar4 = rgb_blue[*(uint *)((long)in_RDI + 0x3c)];
    iVar5 = alpha_index[*(uint *)((long)in_RDI + 0x3c)];
    iVar6 = rgb_pixelsize[*(uint *)((long)in_RDI + 0x3c)];
    if (iVar5 < 0) {
      for (local_7c = (int)in_RDI[6]; local_7c != 0; local_7c = local_7c + -1) {
        local_78[iVar4] = *local_70;
        pbVar9 = local_70 + 2;
        local_78[iVar3] = local_70[1];
        local_70 = local_70 + 3;
        local_78[iVar2] = *pbVar9;
        local_78 = local_78 + iVar6;
      }
    }
    else {
      for (local_7c = (int)in_RDI[6]; local_7c != 0; local_7c = local_7c + -1) {
        local_78[iVar4] = *local_70;
        pbVar9 = local_70 + 2;
        local_78[iVar3] = local_70[1];
        local_70 = local_70 + 3;
        local_78[iVar2] = *pbVar9;
        local_78[iVar5] = 0xff;
        local_78 = local_78 + iVar6;
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_24bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 24-bit pixels */
{
  bmp_source_ptr source = (bmp_source_ptr)sinfo;
  JSAMPARRAY image_ptr;
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;

  if (source->use_inversion_array) {
    /* Fetch next row from virtual array */
    source->source_row--;
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image,
       source->source_row, (JDIMENSION)1, FALSE);
    inptr = image_ptr[0];
  } else {
    if (!ReadOK(source->pub.input_file, source->iobuffer, source->row_width))
      ERREXIT(cinfo, JERR_INPUT_EOF);
    inptr = source->iobuffer;
  }

  /* Transfer data.  Note source values are in BGR order
   * (even though Microsoft's own documents say the opposite).
   */
  outptr = source->pub.buffer[0];
  if (cinfo->in_color_space == JCS_EXT_BGR) {
    MEMCOPY(outptr, inptr, source->row_width);
  } else if (cinfo->in_color_space == JCS_CMYK) {
    for (col = cinfo->image_width; col > 0; col--) {
      JSAMPLE b = *inptr++, g = *inptr++, r = *inptr++;
      rgb_to_cmyk(r, g, b, outptr, outptr + 1, outptr + 2, outptr + 3);
      outptr += 4;
    }
  } else {
    register int rindex = rgb_red[cinfo->in_color_space];
    register int gindex = rgb_green[cinfo->in_color_space];
    register int bindex = rgb_blue[cinfo->in_color_space];
    register int aindex = alpha_index[cinfo->in_color_space];
    register int ps = rgb_pixelsize[cinfo->in_color_space];

    if (aindex >= 0) {
      for (col = cinfo->image_width; col > 0; col--) {
        outptr[bindex] = *inptr++;
        outptr[gindex] = *inptr++;
        outptr[rindex] = *inptr++;
        outptr[aindex] = 0xFF;
        outptr += ps;
      }
    } else {
      for (col = cinfo->image_width; col > 0; col--) {
        outptr[bindex] = *inptr++;
        outptr[gindex] = *inptr++;
        outptr[rindex] = *inptr++;
        outptr += ps;
      }
    }
  }

  return 1;
}